

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O2

optional<const_tinyusdz::Prim_*> *
tinyusdz::anon_unknown_28::GetPrimAtPathRec
          (optional<const_tinyusdz::Prim_*> *__return_storage_ptr__,Prim *parent,string *parent_path
          ,Path *path,uint32_t depth)

{
  pointer pPVar1;
  __type _Var2;
  storage_t<const_tinyusdz::Prim_*> *psVar3;
  pointer parent_00;
  string elementName;
  string abs_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (parent == (Prim *)0x0) {
    __return_storage_ptr__->has_value_ = false;
    __return_storage_ptr__->contained = (storage_t<const_tinyusdz::Prim_*>)0x0;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&local_b0,(string *)&parent->_elementPath);
    std::operator+(&local_50,parent_path,"/");
    std::operator+(&local_90,&local_50,&local_b0);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    Path::full_path_name_abi_cxx11_(&local_90,path);
    _Var2 = std::operator==(&local_70,&local_90);
    std::__cxx11::string::_M_dispose();
    if (_Var2) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<const_tinyusdz::Prim_*>)parent;
      std::__cxx11::string::_M_dispose();
    }
    else {
      std::__cxx11::string::_M_dispose();
      pPVar1 = (parent->_children).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (parent_00 = (parent->_children).
                       super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                       super__Vector_impl_data._M_start; parent_00 != pPVar1;
          parent_00 = parent_00 + 1) {
        GetPrimAtPathRec((optional<const_tinyusdz::Prim_*> *)&local_90,parent_00,&local_70,path,
                         depth + 1);
        local_b0._M_dataplus._M_p._0_1_ = (char)local_90._M_dataplus._M_p;
        if ((char)local_90._M_dataplus._M_p == '\x01') {
          local_b0._M_string_length = local_90._M_string_length;
          psVar3 = (storage_t<const_tinyusdz::Prim_*> *)
                   nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::value
                             ((optional<const_tinyusdz::Prim_*> *)&local_b0);
          __return_storage_ptr__->has_value_ = true;
          __return_storage_ptr__->contained = *psVar3;
          goto LAB_001f3b92;
        }
      }
      __return_storage_ptr__->has_value_ = false;
      __return_storage_ptr__->contained = (storage_t<const_tinyusdz::Prim_*>)0x0;
    }
LAB_001f3b92:
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<const Prim *> GetPrimAtPathRec(const Prim *parent,
                                                const std::string &parent_path,
                                                const Path &path,
                                                const uint32_t depth) {

  if (!parent) {
    return nonstd::nullopt;
  }

  std::string abs_path;
  // if (auto pv = GetPrimElementName(parent->data())) {
  {
    std::string elementName = parent->element_path().prim_part();
    // DCOUT(pprint::Indent(depth) << "Prim elementName = " << elementName);
    // DCOUT(pprint::Indent(depth) << "Given Path = " << path);
    //  fully absolute path
    abs_path = parent_path + "/" + elementName;
    // DCOUT(pprint::Indent(depth) << "abs_path = " << abs_path);
    // DCOUT(pprint::Indent(depth)
    //       << "queriying path = " << path.full_path_name());
    if (abs_path == path.full_path_name()) {
      // DCOUT(pprint::Indent(depth)
      //       << "Got it! Found Prim at Path = " << abs_path);
      return parent;
    }
  }

  // DCOUT(pprint::Indent(depth)
  //       << "# of children : " << parent->children().size());
  for (const auto &child : parent->children()) {
    // const std::string &p = parent->elementPath.full_path_name();
    // DCOUT(pprint::Indent(depth + 1) << "Parent path : " << abs_path);
    if (auto pv = GetPrimAtPathRec(&child, abs_path, path, depth + 1)) {
      return pv.value();
    }
  }

  return nonstd::nullopt;
}